

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdcolmap.c
# Opt level: O0

void read_color_map(j_decompress_ptr cinfo,FILE *infile)

{
  int iVar1;
  long lVar2;
  FILE *in_RSI;
  long *in_RDI;
  FILE *in_stack_00000038;
  j_decompress_ptr in_stack_00000040;
  
  lVar2 = (**(code **)(in_RDI[1] + 0x10))(in_RDI,1,0x100,3);
  in_RDI[0x14] = lVar2;
  *(undefined4 *)((long)in_RDI + 0x9c) = 0;
  iVar1 = getc(in_RSI);
  if (iVar1 == 0x47) {
    read_gif_map(in_stack_00000040,in_stack_00000038);
  }
  else if (iVar1 == 0x50) {
    read_ppm_map(cinfo,infile);
  }
  else {
    *(undefined4 *)(*in_RDI + 0x28) = 0x412;
    (**(code **)*in_RDI)(in_RDI);
  }
  return;
}

Assistant:

GLOBAL(void)
read_color_map(j_decompress_ptr cinfo, FILE *infile)
{
  /* Allocate space for a color map of maximum supported size. */
  cinfo->colormap = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr)cinfo, JPOOL_IMAGE,
     (JDIMENSION)(MAXJSAMPLE + 1), (JDIMENSION)3);
  cinfo->actual_number_of_colors = 0; /* initialize map to empty */

  /* Read first byte to determine file format */
  switch (getc(infile)) {
  case 'G':
    read_gif_map(cinfo, infile);
    break;
  case 'P':
    read_ppm_map(cinfo, infile);
    break;
  default:
    ERREXIT(cinfo, JERR_BAD_CMAP_FILE);
    break;
  }
}